

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::ReadCVars(FGameConfigFile *this,DWORD flags)

{
  bool bVar1;
  UCVarValue val;
  FBaseCVar *cvar;
  char *value;
  char *key;
  FGameConfigFile *pFStack_10;
  DWORD flags_local;
  FGameConfigFile *this_local;
  
  key._4_4_ = flags | 0x121;
  pFStack_10 = this;
  while( true ) {
    bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&value,(char **)&cvar);
    if (!bVar1) break;
    val.pGUID = (GUID *)FindCVar(value,(FBaseCVar **)0x0);
    if ((FBaseCVar *)val.String == (FBaseCVar *)0x0) {
      val.String = (char *)operator_new(0x38);
      FStringCVar::FStringCVar
                ((FStringCVar *)val.pGUID,value,(char *)0x0,key._4_4_,
                 (_func_void_FStringCVar_ptr *)0x0);
    }
    FBaseCVar::SetGenericRep((FBaseCVar *)val.pGUID,(UCVarValue)cvar,CVAR_String);
  }
  return;
}

Assistant:

void FGameConfigFile::ReadCVars (DWORD flags)
{
	const char *key, *value;
	FBaseCVar *cvar;
	UCVarValue val;

	flags |= CVAR_ARCHIVE|CVAR_UNSETTABLE|CVAR_AUTO;
	while (NextInSection (key, value))
	{
		cvar = FindCVar (key, NULL);
		if (cvar == NULL)
		{
			cvar = new FStringCVar (key, NULL, flags);
		}
		val.String = const_cast<char *>(value);
		cvar->SetGenericRep (val, CVAR_String);
	}
}